

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O2

void __thiscall
zmq::stream_engine_base_t::stream_engine_base_t
          (stream_engine_base_t *this,fd_t fd_,options_t *options_,
          endpoint_uri_pair_t *endpoint_uri_pair_,bool has_handshake_stage_)

{
  string *ip_addr_;
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *errmsg_;
  string *ctx;
  ucred cred;
  socklen_t size;
  string local_1c8;
  ostringstream buf;
  
  io_object_t::io_object_t(&this->super_io_object_t,(io_thread_t *)0x0);
  (this->super_io_object_t).super_i_poll_events._vptr_i_poll_events =
       (_func_int **)&PTR__stream_engine_base_t_001d2738;
  (this->super_i_engine)._vptr_i_engine = (_func_int **)&DAT_001d27f8;
  options_t::options_t(&this->_options,options_);
  *(undefined8 *)&this->field_0x560 = 0;
  this->_metadata = (metadata_t *)0x0;
  *(undefined8 *)&this->field_0x550 = 0;
  this->_process_msg = 0;
  this->_mechanism = (mechanism_t *)0x0;
  this->_next_msg = 0;
  this->_outsize = 0;
  this->_encoder = (i_encoder *)0x0;
  this->_decoder = (i_decoder *)0x0;
  this->_outpos = (uchar *)0x0;
  this->_inpos = (uchar *)0x0;
  this->_insize = 0;
  this->_input_stopped = false;
  this->_output_stopped = false;
  endpoint_uri_pair_t::endpoint_uri_pair_t(&this->_endpoint_uri_pair,endpoint_uri_pair_);
  ip_addr_ = &this->_peer_address;
  this->_has_handshake_timer = false;
  this->_has_ttl_timer = false;
  this->_has_timeout_timer = false;
  this->_has_heartbeat_timer = false;
  (this->_peer_address)._M_dataplus._M_p = (pointer)&(this->_peer_address).field_2;
  (this->_peer_address)._M_string_length = 0;
  (this->_peer_address).field_2._M_local_buf[0] = '\0';
  ctx = ip_addr_;
  iVar1 = get_peer_ip_address(fd_,ip_addr_);
  if (iVar1 == 1) {
    size = 0xc;
    ctx = (string *)0x1;
    iVar1 = getsockopt(fd_,1,0x11,&cred,&size);
    if (iVar1 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar2 = std::operator<<((ostream *)&buf,":");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,":");
      std::ostream::operator<<(poVar2,cred.pid);
      std::__cxx11::stringbuf::str();
      ctx = &local_1c8;
      std::__cxx11::string::append((string *)ip_addr_);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    }
  }
  else if (iVar1 == 0) {
    (this->_peer_address)._M_string_length = 0;
    *(this->_peer_address)._M_dataplus._M_p = '\0';
  }
  this->_s = fd_;
  this->_handle = (handle_t)0x0;
  this->_plugged = false;
  this->_handshaking = true;
  this->_io_error = false;
  this->_session = (session_base_t *)0x0;
  this->_socket = (socket_base_t *)0x0;
  this->_has_handshake_stage = has_handshake_stage_;
  iVar1 = msg_t::init(&this->_tx_msg,(EVP_PKEY_CTX *)ctx);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    errmsg_ = strerror(*piVar3);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x88);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  unblock_socket(this->_s);
  return;
}

Assistant:

zmq::stream_engine_base_t::stream_engine_base_t (
  fd_t fd_,
  const options_t &options_,
  const endpoint_uri_pair_t &endpoint_uri_pair_,
  bool has_handshake_stage_) :
    _options (options_),
    _inpos (NULL),
    _insize (0),
    _decoder (NULL),
    _outpos (NULL),
    _outsize (0),
    _encoder (NULL),
    _mechanism (NULL),
    _next_msg (NULL),
    _process_msg (NULL),
    _metadata (NULL),
    _input_stopped (false),
    _output_stopped (false),
    _endpoint_uri_pair (endpoint_uri_pair_),
    _has_handshake_timer (false),
    _has_ttl_timer (false),
    _has_timeout_timer (false),
    _has_heartbeat_timer (false),
    _peer_address (get_peer_address (fd_)),
    _s (fd_),
    _handle (static_cast<handle_t> (NULL)),
    _plugged (false),
    _handshaking (true),
    _io_error (false),
    _session (NULL),
    _socket (NULL),
    _has_handshake_stage (has_handshake_stage_)
{
    const int rc = _tx_msg.init ();
    errno_assert (rc == 0);

    //  Put the socket into non-blocking mode.
    unblock_socket (_s);
}